

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Arg::parse
          (InternalParseResult *__return_storage_ptr__,Arg *this,string *param_1,TokenStream *tokens
          )

{
  pointer pTVar1;
  element_type *peVar2;
  Token token;
  ParserResult result;
  Result validationResult;
  int local_138;
  StringRef SStack_130;
  undefined1 local_118 [48];
  undefined1 local_e8 [24];
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_d0;
  BasicResult<void> local_b8;
  StringRef *local_88;
  StringRef *pSStack_80;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_78;
  StringRef *local_58;
  StringRef *pSStack_50;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_48;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Arg>).super_ComposableParserImpl<Catch::Clara::Arg>.
    super_ParserBase._vptr_ParserBase[2])(&local_b8);
  if (local_b8.super_ResultValueBase<void>.super_ResultBase.m_type == Ok) {
    pTVar1 = (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    SStack_130.m_start = (pTVar1->token).m_start;
    SStack_130.m_size = (pTVar1->token).m_size;
    local_138 = (int)*(undefined8 *)pTVar1;
    if (local_138 == 1) {
      peVar2 = (this->super_ParserRefImpl<Catch::Clara::Arg>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      StringRef::operator_cast_to_string((string *)local_e8,&SStack_130);
      (*peVar2->_vptr_BoundRef[4])(local_118,peVar2,local_e8);
      std::__cxx11::string::~string((string *)local_e8);
      if (local_118._8_4_ == Ok) {
        Detail::TokenStream::operator++(tokens);
        local_88 = (tokens->it)._M_current;
        pSStack_80 = (tokens->itEnd)._M_current;
        local_d0._M_impl.super__Vector_impl_data._M_end_of_storage =
             (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d0._M_impl.super__Vector_impl_data._M_start =
             (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_d0._M_impl.super__Vector_impl_data._M_finish =
             (tokens->m_tokenBuffer).
             super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (tokens->m_tokenBuffer).
        super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8._0_4_ = Matched;
        local_e8._8_8_ = (tokens->it)._M_current;
        local_e8._16_8_ = (tokens->itEnd)._M_current;
        local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (__return_storage_ptr__,(ParseState *)local_e8);
        std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ::~_Vector_base(&local_d0);
        std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
        ::~_Vector_base(&local_78);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>
                  (__return_storage_ptr__,(BasicResult<Catch::Clara::ParseResultType> *)local_118);
      }
      Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult
                ((BasicResult<Catch::Clara::ParseResultType> *)local_118);
    }
    else {
      local_58 = (tokens->it)._M_current;
      pSStack_50 = (tokens->itEnd)._M_current;
      local_118._32_8_ =
           (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118._40_8_ =
           (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118._0_4_ = NoMatch;
      local_118._8_8_ = (tokens->it)._M_current;
      local_118._16_8_ = (tokens->itEnd)._M_current;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118._24_8_ = pTVar1;
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                (__return_storage_ptr__,(ParseState *)local_118);
      std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~_Vector_base((_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     *)(local_118 + 0x18));
      std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~_Vector_base(&local_48);
    }
  }
  else {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&local_b8);
  }
  Detail::BasicResult<void>::~BasicResult(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Arg::parse(std::string const&,
                                               Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto token = *tokens;
            if (token.type != Detail::TokenType::Argument)
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::NoMatch, CATCH_MOVE(tokens)));

            assert(!m_ref->isFlag());
            auto valueRef =
                static_cast<Detail::BoundValueRefBase*>(m_ref.get());

            auto result = valueRef->setValue(static_cast<std::string>(token.token));
            if ( !result )
                return Detail::InternalParseResult( result );
            else
                return Detail::InternalParseResult::ok(
                    Detail::ParseState( ParseResultType::Matched,
                                        CATCH_MOVE( ++tokens ) ) );
        }